

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O0

xmlParserInputPtr xmlNewStringInputStream(xmlParserCtxtPtr ctxt,xmlChar *buffer)

{
  xmlGenericErrorFunc p_Var1;
  int size;
  int *piVar2;
  xmlGenericErrorFunc *pp_Var3;
  void **ppvVar4;
  _xmlSAXHandler *in;
  xmlParserInputBufferPtr buf;
  xmlParserInputPtr input;
  xmlChar *buffer_local;
  xmlParserCtxtPtr ctxt_local;
  
  if (buffer == (xmlChar *)0x0) {
    xmlErrInternal(ctxt,"xmlNewStringInputStream string = NULL\n",(xmlChar *)0x0);
    ctxt_local = (xmlParserCtxtPtr)0x0;
  }
  else {
    piVar2 = __xmlParserDebugEntities();
    if (*piVar2 != 0) {
      pp_Var3 = __xmlGenericError();
      p_Var1 = *pp_Var3;
      ppvVar4 = __xmlGenericErrorContext();
      (*p_Var1)(*ppvVar4,"new fixed input: %.30s\n",buffer);
    }
    size = xmlStrlen(buffer);
    in = (_xmlSAXHandler *)xmlParserInputBufferCreateMem((char *)buffer,size,XML_CHAR_ENCODING_NONE)
    ;
    if (in == (_xmlSAXHandler *)0x0) {
      xmlErrMemory(ctxt,(char *)0x0);
      ctxt_local = (xmlParserCtxtPtr)0x0;
    }
    else {
      ctxt_local = (xmlParserCtxtPtr)xmlNewInputStream(ctxt);
      if (ctxt_local == (xmlParserCtxtPtr)0x0) {
        xmlErrMemory(ctxt,"couldn\'t allocate a new input stream\n");
        xmlFreeParserInputBuffer((xmlParserInputBufferPtr)in);
        ctxt_local = (xmlParserCtxtPtr)0x0;
      }
      else {
        ctxt_local->sax = in;
        xmlBufResetInput((xmlBufPtr)ctxt_local->sax->resolveEntity,(xmlParserInputPtr)ctxt_local);
      }
    }
  }
  return (xmlParserInputPtr)ctxt_local;
}

Assistant:

xmlParserInputPtr
xmlNewStringInputStream(xmlParserCtxtPtr ctxt, const xmlChar *buffer) {
    xmlParserInputPtr input;
    xmlParserInputBufferPtr buf;

    if (buffer == NULL) {
        xmlErrInternal(ctxt, "xmlNewStringInputStream string = NULL\n",
	               NULL);
	return(NULL);
    }
    if (xmlParserDebugEntities)
	xmlGenericError(xmlGenericErrorContext,
		"new fixed input: %.30s\n", buffer);
    buf = xmlParserInputBufferCreateMem((const char *) buffer,
                                        xmlStrlen(buffer),
                                        XML_CHAR_ENCODING_NONE);
    if (buf == NULL) {
	xmlErrMemory(ctxt, NULL);
        return(NULL);
    }
    input = xmlNewInputStream(ctxt);
    if (input == NULL) {
        xmlErrMemory(ctxt,  "couldn't allocate a new input stream\n");
	xmlFreeParserInputBuffer(buf);
	return(NULL);
    }
    input->buf = buf;
    xmlBufResetInput(input->buf->buffer, input);
    return(input);
}